

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::BackgroundScanStack(Recycler *this)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  void **obj;
  undefined4 *puVar5;
  size_t byteCount;
  
  if (this->skipStack == true) {
    bVar3 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,ScanStackPhase);
    if ((bVar3) && (this->recyclerFlagsTable->Verbose == true)) {
      DVar4 = GetCurrentThreadId();
      Output::Print(L"[%04X] Skipping the stack scan\n",(ulong)DVar4);
      Output::Flush();
      return 0;
    }
  }
  else {
    if (this->isInScript != true) {
      return 0;
    }
    if (this->mainThreadHandle == (HANDLE)0x0) {
      return 0;
    }
    obj = (void **)GetScriptThreadStackTop(this);
    if (obj != (void **)0x0) {
      pvVar1 = this->stackBase;
      if ((this->collectionState).value == CollectionStateParallelMark) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x1ef,"(this->collectionState != CollectionStateParallelMark)",
                           "this->collectionState != CollectionStateParallelMark");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      byteCount = (long)pvVar1 - (long)obj;
      if (this->enableScanInteriorPointers == true) {
        MarkContext::ScanMemory<false,true,false>(&this->markContext,obj,byteCount);
        return byteCount;
      }
      MarkContext::ScanMemory<false,false,false>(&this->markContext,obj,byteCount);
      return byteCount;
    }
  }
  return 0;
}

Assistant:

size_t
Recycler::BackgroundScanStack()
{
    if (this->skipStack)
    {
#ifdef RECYCLER_TRACE
        CUSTOM_PHASE_PRINT_VERBOSE_TRACE1(GetRecyclerFlagsTable(), Js::ScanStackPhase, _u("[%04X] Skipping the stack scan\n"), ::GetCurrentThreadId());
#endif
        return 0;
    }

    if (!this->isInScript || mainThreadHandle == nullptr)
    {
        // No point in scanning the main thread's stack if we are not in script
        // We also can't scan the main thread's stack if we are not thread bounded, and didn't create the main thread's handle
        return 0;
    }

    char* stackTop = this->GetScriptThreadStackTop();

    if (stackTop != nullptr)
    {
        size_t size = (char *)stackBase - stackTop;
        ScanMemoryInline<false>((void **)stackTop, size
            ADDRESS_SANITIZER_APPEND(RecyclerScanMemoryType::Stack));
        return size;
    }

    return 0;
}